

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

longdouble *
calc_sd_right_to_left_weighted<float,std::vector<double,std::allocator<double>>,long_double>
          (longdouble *__return_storage_ptr__,float *x,float xmean,size_t *ix_arr,size_t st,
          size_t end,double *sd_arr,vector<double,_std::allocator<double>_> *w,longdouble *cumw)

{
  double dVar1;
  long lVar2;
  long lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  
  fVar9 = *(float *)((long)__return_storage_ptr__ + *(long *)(x + st * 2) * 4) - xmean;
  dVar1 = *sd_arr;
  lVar6 = (longdouble)0;
  lVar3 = 0;
  lVar8 = lVar6;
  lVar7 = lVar6;
  while ((long)ix_arr - st != lVar3) {
    lVar2 = *(long *)(x + st * 2 + lVar3 * 2);
    lVar4 = (longdouble)*(double *)((long)dVar1 + lVar2 * 8);
    lVar6 = lVar6 + lVar4;
    fVar10 = *(float *)((long)__return_storage_ptr__ + lVar2 * 4) - xmean;
    lVar5 = (longdouble)fVar10;
    lVar8 = ((lVar5 - lVar8) * lVar4) / lVar6 + lVar8;
    lVar7 = (lVar5 - lVar8) * (longdouble)(fVar10 - fVar9) * lVar4 + lVar7;
    fVar9 = (float)lVar8;
    dVar11 = 0.0;
    if (lVar3 != 0) {
      dVar11 = (double)SQRT(lVar7 / lVar6);
    }
    *(double *)(st * 8 + (long)ix_arr * -8 + end + lVar3 * 8) = dVar11;
    lVar3 = lVar3 + -1;
  }
  *(longdouble *)
   &(w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data =
       lVar6 + (longdouble)*(double *)((long)dVar1 + *(long *)(x + (long)ix_arr * 2) * 8);
  return (longdouble *)w;
}

Assistant:

ldouble_safe calc_sd_right_to_left_weighted(real_t_ *restrict x, real_t_ xmean, size_t ix_arr[], size_t st, size_t end,
                                           double *restrict sd_arr, mapping &restrict w, ldouble_safe &cumw)
{
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    real_t_ mean_prev = x[ix_arr[end]] - xmean;
    size_t n = end - st + 1;
    ldouble_safe cnt = 0;
    double w_this;
    for (size_t row = 0; row < n-1; row++)
    {
        w_this = w[ix_arr[end-row]];
        cnt += w_this;
        running_mean   += w_this * ((x[ix_arr[end-row]] - xmean) - running_mean) / cnt;
        running_ssq    += w_this * (((x[ix_arr[end-row]] - xmean) - running_mean) * ((x[ix_arr[end-row]] - xmean) - mean_prev));
        mean_prev       =  running_mean;
        sd_arr[n-row-1] = (row == 0)? 0. : std::sqrt(running_ssq / cnt);
    }
    w_this = w[ix_arr[st]];
    cnt += w_this;
    running_mean   += ((x[ix_arr[st]] - xmean) - running_mean) / cnt;
    running_ssq    += w_this * (((x[ix_arr[st]] - xmean) - running_mean) * ((x[ix_arr[st]] - xmean) - mean_prev));
    cumw = cnt;
    return std::sqrt(running_ssq / cnt);
}